

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O3

void Llb_MtrRemoveSingletonRows(Llb_Mtr_t *p)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  if (0 < p->nRows) {
    lVar1 = 0;
    do {
      if (p->pRowSums[lVar1] < 2) {
        p->pRowSums[lVar1] = 0;
        iVar2 = p->nCols;
        if (0 < iVar2) {
          lVar3 = 0;
          do {
            if (p->pMatrix[lVar3][lVar1] == '\x01') {
              p->pMatrix[lVar3][lVar1] = '\0';
              p->pColSums[lVar3] = p->pColSums[lVar3] + -1;
              iVar2 = p->nCols;
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 < iVar2);
        }
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < p->nRows);
  }
  return;
}

Assistant:

void Llb_MtrRemoveSingletonRows( Llb_Mtr_t * p )
{
    int i, k;
    for ( i = 0; i < p->nRows; i++ )
        if ( p->pRowSums[i] < 2 )
        {
            p->pRowSums[i] = 0;
            for ( k = 0; k < p->nCols; k++ )
            {
                if ( p->pMatrix[k][i] == 1 )
                {
                    p->pMatrix[k][i] = 0;
                    p->pColSums[k]--;
                }
            }
        }
}